

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

void OperandSize8RM(OPTYPE *pMyOperand,PDISASM pMyDisasm,size_t i,int index)

{
  Int64 IVar1;
  
  if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
    strcpy(pMyOperand->OpMnemonic + i,Registers8Bits[(long)index + 8]);
    pMyOperand->OpType = 0x20000;
    (pMyOperand->Registers).type = 1;
    IVar1 = REGS[(long)index + 8];
  }
  else if ((pMyDisasm->Reserved_).REX.state == '\0') {
    strcpy(pMyOperand->OpMnemonic + i,Registers8BitsLegacy[index]);
    pMyOperand->OpType = 0x20000;
    (pMyOperand->Registers).type = 1;
    IVar1 = (Int64)REGS8BITS[index];
  }
  else {
    strcpy(pMyOperand->OpMnemonic + i,Registers8Bits[index]);
    pMyOperand->OpType = 0x20000;
    (pMyOperand->Registers).type = 1;
    IVar1 = REGS[index];
  }
  (pMyOperand->Registers).gpr = IVar1;
  pMyOperand->OpSize = 8;
  return;
}

Assistant:

void __bea_callspec__ OperandSize8RM(OPTYPE* pMyOperand, PDISASM pMyDisasm, size_t i, int index)
{
  if (GV.REX.B_ == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers8Bits[index+8]);
      #endif
      pMyOperand->OpType = REGISTER_TYPE;
      pMyOperand->Registers.type = GENERAL_REG;
      pMyOperand->Registers.gpr = REGS[index+8];
      pMyOperand->OpSize = 8;
  }
  else {
      if (GV.REX.state == 0) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers8BitsLegacy[index+0]);
          #endif
          pMyOperand->OpType = REGISTER_TYPE;
          pMyOperand->Registers.type = GENERAL_REG;
          pMyOperand->Registers.gpr = REGS8BITS[index+0];
          pMyOperand->OpSize = 8;
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers8Bits[index+0]);
          #endif
          pMyOperand->OpType = REGISTER_TYPE;
          pMyOperand->Registers.type = GENERAL_REG;
          pMyOperand->Registers.gpr = REGS[index+0];
          pMyOperand->OpSize = 8;
      }
  }

}